

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

long __thiscall
Imath_3_2::Frustum<float>::DepthToZExc(Frustum<float> *this,float depth,long zmin,long zmax)

{
  domain_error *pdVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float Zp_1;
  float farPlusNear_1;
  float farTimesNear;
  float Zp;
  float farPlusNear;
  float farMinusNear;
  long zdiff;
  long local_8;
  
  fVar2 = *(float *)(in_RDI + 0xc) - *(float *)(in_RDI + 8);
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    fVar3 = *(float *)(in_RDI + 0xc) * 2.0 * *(float *)(in_RDI + 8);
    fVar4 = abs<float>(in_XMM0_Da);
    if (fVar4 < 1.0) {
      fVar4 = abs<float>(fVar3);
      fVar5 = std::numeric_limits<float>::max();
      fVar6 = abs<float>(in_XMM0_Da);
      if (fVar5 * fVar6 < fVar4) {
        pdVar1 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (pdVar1,"Bad call to DepthToZ function: value of `depth\' is too small");
        __cxa_throw(pdVar1,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
    }
    fVar3 = fVar3 / in_XMM0_Da + *(float *)(in_RDI + 0xc) + *(float *)(in_RDI + 8);
    fVar4 = abs<float>(fVar2);
    if (fVar4 < 1.0) {
      fVar4 = abs<float>(fVar3);
      fVar5 = std::numeric_limits<float>::max();
      fVar6 = abs<float>(fVar2);
      if (fVar5 * fVar6 < fVar4) {
        pdVar1 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (pdVar1,
                   "Bad viewing frustum: near and far clipping planes are too close to each other");
        __cxa_throw(pdVar1,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
    }
    fVar2 = (fVar3 / fVar2 + 1.0) * 0.5 * (float)(in_RDX - in_RSI);
  }
  else {
    fVar3 = in_XMM0_Da + in_XMM0_Da + *(float *)(in_RDI + 0xc) + *(float *)(in_RDI + 8);
    fVar4 = abs<float>(fVar2);
    if (fVar4 < 1.0) {
      fVar4 = abs<float>(fVar3);
      fVar5 = std::numeric_limits<float>::max();
      fVar6 = abs<float>(fVar2);
      if (fVar5 * fVar6 < fVar4) {
        pdVar1 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (pdVar1,
                   "Bad viewing frustum: near and far clipping planes are too close to each other");
        __cxa_throw(pdVar1,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
    }
    fVar2 = (-fVar3 / fVar2 + 1.0) * 0.5 * (float)(in_RDX - in_RSI);
  }
  local_8 = (long)fVar2 + in_RSI;
  return local_8;
}

Assistant:

IMATH_CONSTEXPR14 long
Frustum<T>::DepthToZExc (T depth, long zmin, long zmax) const
{
    long zdiff        = zmax - zmin;
    T    farMinusNear = _farPlane - _nearPlane;

    if (_orthographic)
    {
        T farPlusNear = T (2) * depth + _farPlane + _nearPlane;

        if (abs (farMinusNear) < T (1) &&
            abs (farPlusNear) >
                std::numeric_limits<T>::max () * abs (farMinusNear))
        {
            throw std::domain_error ("Bad viewing frustum: "
                                     "near and far clipping planes "
                                     "are too close to each other");
        }

        T Zp = -farPlusNear / farMinusNear;
        return long (0.5 * (Zp + 1) * zdiff) + zmin;
    }
    else
    {
        // Perspective

        T farTimesNear = T (2) * _farPlane * _nearPlane;
        if (abs (depth) < T (1) &&
            abs (farTimesNear) > std::numeric_limits<T>::max () * abs (depth))
        {
            throw std::domain_error ("Bad call to DepthToZ function: "
                                     "value of `depth' is too small");
        }

        T farPlusNear = farTimesNear / depth + _farPlane + _nearPlane;
        if (abs (farMinusNear) < T (1) &&
            abs (farPlusNear) >
                std::numeric_limits<T>::max () * abs (farMinusNear))
        {
            throw std::domain_error ("Bad viewing frustum: "
                                     "near and far clipping planes "
                                     "are too close to each other");
        }

        T Zp = farPlusNear / farMinusNear;
        return long (0.5 * (Zp + 1) * zdiff) + zmin;
    }
}